

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O2

void jsonip::
     write<std::vector<std::vector<A,std::allocator<A>>,std::allocator<std::vector<A,std::allocator<A>>>>>
               (ostream *os,
               vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
               *t,bool indent)

{
  undefined3 in_register_00000011;
  undefined1 local_20 [8];
  writer<true> w;
  
  local_20 = (undefined1  [8])os;
  if (CONCAT31(in_register_00000011,indent) == 0) {
    w.os._0_1_ = 0;
    w.comma = false;
    w._9_7_ = 0;
    detail::
    stl_pushbackable_helper<std::vector<std::vector<A,std::allocator<A>>,std::allocator<std::vector<A,std::allocator<A>>>>>
    ::write<jsonip::writer<false>>((writer<false> *)local_20,t);
  }
  else {
    w.os._0_1_ = 0;
    w.comma = false;
    w._9_7_ = 0;
    detail::
    stl_pushbackable_helper<std::vector<std::vector<A,std::allocator<A>>,std::allocator<std::vector<A,std::allocator<A>>>>>
    ::write<jsonip::writer<true>>((writer<true> *)local_20,t);
  }
  return;
}

Assistant:

void write(std::ostream& os, const T& t, bool indent = true)
    {
        if (indent)
        {
            writer<true> w(os);
            detail::calculate_helper<T>::type::write(w, t);
        }
        else
        {
            writer<false> w(os);
            detail::calculate_helper<T>::type::write(w, t);
        }
    }